

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void addDataTypeNode(UA_Server *server,char *name,UA_UInt32 datatypeid,UA_Boolean isAbstract,
                    UA_UInt32 parent)

{
  UA_NodeId parentNodeId;
  UA_NodeId referenceTypeId;
  UA_Node *node;
  char *server_00;
  UA_AddNodesResult local_68;
  UA_NodeId local_48;
  UA_Node *local_30;
  UA_DataTypeNode *datatype;
  byte local_1d;
  UA_UInt32 parent_local;
  UA_Boolean isAbstract_local;
  char *pcStack_18;
  UA_UInt32 datatypeid_local;
  char *name_local;
  UA_Server *server_local;
  
  datatype._4_4_ = parent;
  local_1d = isAbstract;
  parent_local = datatypeid;
  pcStack_18 = name;
  name_local = (char *)server;
  local_30 = UA_NodeStore_newNode(UA_NODECLASS_DATATYPE);
  copyNames(local_30,pcStack_18);
  server_00 = name_local;
  node = local_30;
  (local_30->nodeId).identifier.numeric = parent_local;
  *(byte *)&local_30[1].nodeId.namespaceIndex = local_1d & 1;
  UA_NODEID_NUMERIC(&local_48,0,datatype._4_4_);
  parentNodeId.identifier.string.length = local_48.identifier.string.length;
  parentNodeId.namespaceIndex = local_48.namespaceIndex;
  parentNodeId._2_2_ = local_48._2_2_;
  parentNodeId.identifierType = local_48.identifierType;
  parentNodeId.identifier.string.data = local_48.identifier.string.data;
  referenceTypeId.identifier.string.data = (UA_Byte *)0x0;
  referenceTypeId._0_16_ = ZEXT816((ulong)0x2d) << 0x40;
  addNodeInternal(&local_68,(UA_Server *)server_00,node,parentNodeId,referenceTypeId);
  return;
}

Assistant:

static void
addDataTypeNode(UA_Server *server, char* name, UA_UInt32 datatypeid,
                UA_Boolean isAbstract, UA_UInt32 parent) {
    UA_DataTypeNode *datatype = UA_NodeStore_newDataTypeNode();
    copyNames((UA_Node*)datatype, name);
    datatype->nodeId.identifier.numeric = datatypeid;
    datatype->isAbstract = isAbstract;
    addNodeInternal(server, (UA_Node*)datatype,
                    UA_NODEID_NUMERIC(0, parent), nodeIdHasSubType);
}